

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnpy.h
# Opt level: O0

vector<char,_std::allocator<char>_> *
cnpy::create_npy_header<double>(vector<unsigned_long,_std::allocator<unsigned_long>_> *shape)

{
  undefined1 uVar1;
  undefined1 uVar2;
  value_type_conflict1 *pvVar3;
  size_type sVar4;
  reference pvVar5;
  iterator __position;
  iterator __first;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  vector *in_RDI;
  int remainder;
  size_t i;
  vector<char,_std::allocator<char>_> dict;
  vector<char,_std::allocator<char>_> *header;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  unsigned_short rhs;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  vector<char,_std::allocator<char>_> *this;
  value_type_conflict1 *__x;
  undefined6 in_stack_fffffffffffffee8;
  const_iterator __position_00;
  vector *this_00;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_ffffffffffffff08;
  string local_a0 [32];
  value_type_conflict1 *local_80;
  string local_78 [32];
  string local_58 [48];
  vector<char,_std::allocator<char>_> local_28;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_10;
  
  this_00 = (vector *)&local_28;
  __position_00._M_current = (char *)in_RDI;
  local_10 = in_RSI;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x115366);
  cnpy::operator+=(this_00,"{\'descr\': \'");
  uVar1 = cnpy::BigEndianTest();
  operator+=(in_stack_fffffffffffffed0,(char)((ulong)in_stack_fffffffffffffec8 >> 0x38));
  uVar2 = cnpy::map_type((type_info *)&double::typeinfo);
  operator+=(in_stack_fffffffffffffed0,(char)((ulong)in_stack_fffffffffffffec8 >> 0x38));
  std::__cxx11::to_string((unsigned_long)__position_00._M_current);
  cnpy::operator+=(&local_28,local_58);
  std::__cxx11::string::~string(local_58);
  cnpy::operator+=((vector *)&local_28,"\', \'fortran_order\': False, \'shape\': (");
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](local_10,0);
  std::__cxx11::to_string((unsigned_long)__position_00._M_current);
  cnpy::operator+=(&local_28,local_78);
  std::__cxx11::string::~string(local_78);
  local_80 = (value_type_conflict1 *)0x1;
  while( true ) {
    __x = local_80;
    pvVar3 = (value_type_conflict1 *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_10);
    rhs = (unsigned_short)((ulong)in_stack_fffffffffffffec8 >> 0x30);
    if (pvVar3 <= __x) break;
    cnpy::operator+=((vector *)&local_28,", ");
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              (local_10,(size_type)local_80);
    std::__cxx11::to_string((unsigned_long)__position_00._M_current);
    cnpy::operator+=(&local_28,local_a0);
    std::__cxx11::string::~string(local_a0);
    local_80 = local_80 + 1;
  }
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_10);
  if (sVar4 == 1) {
    cnpy::operator+=((vector *)&local_28,",");
  }
  cnpy::operator+=((vector *)&local_28,"), }");
  this = &local_28;
  std::vector<char,_std::allocator<char>_>::size(this);
  std::vector<char,_std::allocator<char>_>::end(in_stack_fffffffffffffeb8);
  __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
  __normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
             in_stack_fffffffffffffec0,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)
             in_stack_fffffffffffffeb8);
  std::vector<char,_std::allocator<char>_>::insert
            ((vector<char,_std::allocator<char>_> *)in_RDI,__position_00,
             CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffee8)),__x);
  pvVar5 = std::vector<char,_std::allocator<char>_>::back(in_stack_fffffffffffffec0);
  *pvVar5 = '\n';
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x115680);
  operator+=(this,(char)(rhs >> 8));
  cnpy::operator+=(in_RDI,"NUMPY");
  operator+=(this,(char)(rhs >> 8));
  operator+=(this,(char)(rhs >> 8));
  std::vector<char,_std::allocator<char>_>::size(&local_28);
  operator+=(this,rhs);
  std::vector<char,_std::allocator<char>_>::end(in_stack_fffffffffffffeb8);
  __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
  __normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
             in_stack_fffffffffffffec0,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)
             in_stack_fffffffffffffeb8);
  __position = std::vector<char,_std::allocator<char>_>::begin(in_stack_fffffffffffffeb8);
  __first = std::vector<char,_std::allocator<char>_>::end(in_stack_fffffffffffffeb8);
  std::vector<char,std::allocator<char>>::
  insert<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
            ((vector<char,_std::allocator<char>_> *)this_00,(const_iterator)__position._M_current,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             __first._M_current,in_stack_ffffffffffffff08);
  std::vector<char,_std::allocator<char>_>::~vector(this);
  return (vector<char,_std::allocator<char>_> *)__position_00._M_current;
}

Assistant:

std::vector<char> create_npy_header(const std::vector<size_t>& shape) {  

        std::vector<char> dict;
        dict += "{'descr': '";
        dict += BigEndianTest();
        dict += map_type(typeid(T));
        dict += std::to_string(sizeof(T));
        dict += "', 'fortran_order': False, 'shape': (";
        dict += std::to_string(shape[0]);
        for(size_t i = 1;i < shape.size();i++) {
            dict += ", ";
            dict += std::to_string(shape[i]);
        }
        if(shape.size() == 1) dict += ",";
        dict += "), }";
        //pad with spaces so that preamble+dict is modulo 16 bytes. preamble is 10 bytes. dict needs to end with \n
        int remainder = 16 - (10 + dict.size()) % 16;
        dict.insert(dict.end(),remainder,' ');
        dict.back() = '\n';

        std::vector<char> header;
        header += (char) 0x93;
        header += "NUMPY";
        header += (char) 0x01; //major version of numpy format
        header += (char) 0x00; //minor version of numpy format
        header += (uint16_t) dict.size();
        header.insert(header.end(),dict.begin(),dict.end());

        return header;
    }